

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

_Bool find_empty_range(chunk_conflict *c,loc *grid,loc top_left,loc bottom_right)

{
  _Bool _Var1;
  loc *grid_local;
  chunk_conflict *c_local;
  loc bottom_right_local;
  loc top_left_local;
  
  _Var1 = cave_find_in_range(c,grid,top_left,bottom_right,square_isempty);
  return _Var1;
}

Assistant:

bool find_empty_range(struct chunk *c, struct loc *grid, struct loc top_left,
	struct loc bottom_right)
{
	return cave_find_in_range(c, grid, top_left, bottom_right,
		square_isempty);
}